

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

bool __thiscall asl::Socket_::waitInput(Socket_ *this,double t)

{
  ulong uVar1;
  double dVar2;
  uint __i;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  timeval to;
  timeval local_a8;
  fd_set rset;
  
  if (-1 < *(int *)&(this->super_SmartObject_).field_0xc) {
    iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])();
    bVar6 = true;
    if (iVar3 < 1) {
      if (iVar3 < 0) {
        this->_error = 6;
      }
      else {
        dVar2 = floor(t);
        local_a8.tv_sec._0_4_ = (int)dVar2;
        local_a8.tv_usec._0_4_ = (int)((t - dVar2) * 1000000.0);
        local_a8.tv_sec._4_4_ = -(uint)((int)local_a8.tv_sec < 0);
        local_a8.tv_usec._4_4_ = -(uint)((int)local_a8.tv_usec < 0);
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          rset.fds_bits[lVar5] = 0;
        }
        iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar4 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        rset.fds_bits[iVar4 / 0x40] =
             rset.fds_bits[iVar4 / 0x40] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
        iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar3 = select(iVar3 + 1,(fd_set *)&rset,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
        if (iVar3 < 0) {
          this->_error = 7;
          bVar6 = true;
        }
        else {
          iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          uVar1 = rset.fds_bits[iVar3 / 0x40];
          iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          bVar6 = (uVar1 >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0;
        }
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool Socket_::waitInput(double t)
{
	if (_handle < 0)
		return false;
	int a = available();
	if (a > 0)
		return true;
	if (a < 0)
	{
		_error = SOCKET_BAD_DATA;
		return true;
	}
	fd_set rset;
	timeval to;
	to.tv_sec = (int)floor(t);
	to.tv_usec = (int)((t-floor(t))*1e6);
	FD_ZERO(&rset);
	FD_SET(handle(), &rset);
	if(select(handle()+1, &rset, 0, 0, &to) >= 0)
		return FD_ISSET(handle(), &rset)!=0;
	_error = SOCKET_BAD_WAIT;
	return true;
}